

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O3

int nn_req_create(void *hint,nn_sockbase **sockbase)

{
  nn_req *self;
  
  self = (nn_req *)nn_alloc_(0x540);
  if (self != (nn_req *)0x0) {
    nn_req_init(self,&nn_req_sockbase_vfptr,hint);
    *sockbase = (nn_sockbase *)self;
    return 0;
  }
  nn_req_create_cold_1();
}

Assistant:

static int nn_req_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_req *self;

    self = nn_alloc (sizeof (struct nn_req), "socket (req)");
    alloc_assert (self);
    nn_req_init (self, &nn_req_sockbase_vfptr, hint);
    *sockbase = &self->xreq.sockbase;

    return 0;
}